

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O3

void duckdb::
     VectorArgMinMaxBase<duckdb::LessThan,true,(duckdb::OrderType)2,duckdb::GenericArgMinMaxState<(duckdb::OrderType)2>>
     ::Update<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>>
               (Vector *inputs,AggregateInputData *param_2,idx_t input_count,Vector *state_vector,
               idx_t count)

{
  char *pcVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  undefined8 *puVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  string_t new_value;
  string_t new_value_00;
  SelectionVector sel;
  Vector sort_key;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat bdata;
  UnifiedVectorFormat adata;
  Vector extra_state;
  Vector sliced_input;
  sel_t assign_sel [2048];
  SelectionVector local_2278;
  LogicalType local_2260 [24];
  undefined1 local_2248 [32];
  long local_2228;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21e8;
  long *local_21e0;
  long local_21d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_21a0;
  long *local_2198;
  long local_2190;
  long local_2188;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2158;
  long *local_2150 [2];
  long local_2140;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2130;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2110;
  GenericArgMinMaxState<(duckdb::OrderType)2> local_2108 [8];
  LogicalType local_2100 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20a8;
  Vector local_20a0 [8];
  LogicalType local_2098 [48];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2068;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2050;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2040;
  OrderModifiers local_2038 [4100];
  
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_2150);
  duckdb::Vector::ToUnifiedFormat((ulong)inputs,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_2198);
  GenericArgMinMaxState<(duckdb::OrderType)2>::CreateExtraState(local_2108,count);
  local_2038[0].order_type = ASCENDING;
  local_2038[0].null_type = NULLS_LAST;
  duckdb::CreateSortKeyHelpers::CreateSortKeyWithValidity
            (inputs + 0x68,(Vector *)local_2108,local_2038,count);
  duckdb::Vector::ToUnifiedFormat((ulong)local_2108,(UnifiedVectorFormat *)count);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_21e0);
  duckdb::Vector::ToUnifiedFormat((ulong)state_vector,(UnifiedVectorFormat *)count);
  if (count != 0) {
    pcVar6 = (char *)0x0;
    uVar8 = 0;
    uVar4 = 0;
    do {
      uVar3 = uVar4;
      if (*local_2198 != 0) {
        uVar3 = (ulong)*(uint *)(*local_2198 + uVar4 * 4);
      }
      if ((local_2188 == 0) ||
         ((*(ulong *)(local_2188 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
        puVar5 = (undefined8 *)(local_2190 + uVar3 * 0x10);
        local_2248._0_8_ = *puVar5;
        local_2248._8_8_ = puVar5[1];
        uVar3 = uVar4;
        if (*local_2150[0] != 0) {
          uVar3 = (ulong)*(uint *)(*local_2150[0] + uVar4 * 4);
        }
        if ((local_2140 == 0) ||
           ((*(ulong *)(local_2140 + (uVar3 >> 6) * 8) >> (uVar3 & 0x3f) & 1) != 0)) {
          lVar7 = *local_21e0;
          uVar3 = uVar4;
          if (lVar7 != 0) {
            uVar3 = (ulong)*(uint *)(lVar7 + uVar4 * 4);
          }
          pcVar1 = *(char **)(local_21d8 + uVar3 * 8);
          if ((*pcVar1 != '\x01') ||
             (bVar2 = string_t::StringComparisonOperators::GreaterThan
                                ((string_t *)(pcVar1 + 0x18),(string_t *)local_2248), bVar2)) {
            new_value.value.pointer.ptr = (char *)lVar7;
            new_value.value._0_8_ = local_2248._8_8_;
            ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                      ((ArgMinMaxStateBase *)(pcVar1 + 0x18),(string_t *)local_2248._0_8_,new_value)
            ;
            pcVar1[1] = '\0';
            lVar7 = uVar8 - (pcVar1 == pcVar6);
            *(int *)(local_2038 + lVar7 * 2) = (int)uVar4;
            uVar8 = lVar7 + 1;
            *pcVar1 = '\x01';
            pcVar6 = pcVar1;
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while (count != uVar4);
    if (uVar8 != 0) {
      duckdb::LogicalType::LogicalType(local_2260,BLOB);
      duckdb::Vector::Vector((Vector *)local_2248,local_2260,0x800);
      duckdb::LogicalType::~LogicalType(local_2260);
      local_2278.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_2278.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2278.sel_vector = (sel_t *)local_2038;
      duckdb::Vector::Vector(local_20a0,inputs,&local_2278,uVar8);
      duckdb::CreateSortKeyHelpers::CreateSortKey
                (local_20a0,uVar8,(OrderModifiers)0x302,(Vector *)local_2248);
      puVar5 = (undefined8 *)(local_2228 + 8);
      uVar4 = 0;
      do {
        uVar3 = uVar4;
        if ((OrderModifiers *)local_2278.sel_vector != (OrderModifiers *)0x0) {
          uVar3 = (ulong)*(uint *)((long)local_2278.sel_vector + uVar4 * 2 * 2);
        }
        lVar7 = *local_21e0;
        if (lVar7 != 0) {
          uVar3 = (ulong)*(uint *)(lVar7 + uVar3 * 4);
        }
        new_value_00.value.pointer.ptr = (char *)lVar7;
        new_value_00.value._0_8_ = *puVar5;
        ArgMinMaxStateBase::AssignValue<duckdb::string_t>
                  ((ArgMinMaxStateBase *)(*(long *)(local_21d8 + uVar3 * 8) + 8),
                   (string_t *)puVar5[-1],new_value_00);
        uVar4 = uVar4 + 1;
        puVar5 = puVar5 + 2;
      } while (uVar8 != uVar4);
      if (local_2040 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2040);
      }
      if (local_2050 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2050);
      }
      if (local_2068 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2068);
      }
      duckdb::LogicalType::~LogicalType(local_2098);
      if (local_2278.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2278.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_21e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21e8);
      }
      if (local_21f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21f8);
      }
      if (local_2210 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2210);
      }
      duckdb::LogicalType::~LogicalType((LogicalType *)(local_2248 + 8));
    }
  }
  if (local_21a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21a0);
  }
  if (local_21c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_21c0);
  }
  if (local_20a8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20a8);
  }
  if (local_20b8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20b8);
  }
  if (local_20d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20d0);
  }
  duckdb::LogicalType::~LogicalType(local_2100);
  if (local_2158 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2158);
  }
  if (local_2178 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2178);
  }
  if (local_2110 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2110);
  }
  if (local_2130 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2130);
  }
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &, idx_t input_count, Vector &state_vector, idx_t count) {
		auto &arg = inputs[0];
		UnifiedVectorFormat adata;
		arg.ToUnifiedFormat(count, adata);

		using ARG_TYPE = typename STATE::ARG_TYPE;
		using BY_TYPE = typename STATE::BY_TYPE;
		auto &by = inputs[1];
		UnifiedVectorFormat bdata;
		auto extra_state = UPDATE_TYPE::CreateExtraState(count);
		UPDATE_TYPE::PrepareData(by, count, extra_state, bdata);
		const auto bys = UnifiedVectorFormat::GetData<BY_TYPE>(bdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		STATE *last_state = nullptr;
		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto bidx = bdata.sel->get_index(i);
			if (!bdata.validity.RowIsValid(bidx)) {
				continue;
			}
			const auto bval = bys[bidx];

			const auto aidx = adata.sel->get_index(i);
			const auto arg_null = !adata.validity.RowIsValid(aidx);
			if (IGNORE_NULL && arg_null) {
				continue;
			}

			const auto sidx = sdata.sel->get_index(i);
			auto &state = *states[sidx];
			if (!state.is_initialized || COMPARATOR::template Operation<BY_TYPE>(bval, state.value)) {
				STATE::template AssignValue<BY_TYPE>(state.value, bval);
				state.arg_null = arg_null;
				// micro-adaptivity: it is common we overwrite the same state repeatedly
				// e.g. when running arg_max(val, ts) and ts is sorted in ascending order
				// this check essentially says:
				// "if we are overriding the same state as the last row, the last write was pointless"
				// hence we skip the last write altogether
				if (!arg_null) {
					if (&state == last_state) {
						assign_count--;
					}
					assign_sel[assign_count++] = UnsafeNumericCast<sel_t>(i);
					last_state = &state;
				}
				state.is_initialized = true;
			}
		}
		if (assign_count == 0) {
			// no need to assign anything: nothing left to do
			return;
		}
		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		SelectionVector sel(assign_sel);
		Vector sliced_input(arg, sel, assign_count);
		CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto sidx = sdata.sel->get_index(sel.get_index(i));
			auto &state = *states[sidx];
			STATE::template AssignValue<ARG_TYPE>(state.arg, sort_key_data[i]);
		}
	}